

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O0

bool __thiscall
llama_kv_cache_unified::state_read_data
          (llama_kv_cache_unified *this,llama_io_read_i *io,uint32_t cell_count)

{
  value_type pgVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  reference ppgVar4;
  undefined8 uVar5;
  long lVar6;
  uint in_EDX;
  long *in_RSI;
  long in_RDI;
  size_t dst_offset;
  uint32_t j;
  uint32_t n_embd_v_gqa_ref;
  size_t v_size_el;
  uint32_t v_size_el_ref;
  int32_t v_type_i_1;
  int32_t v_type_i_ref_1;
  uint32_t n_embd_v_gqa_1;
  uint32_t il_2;
  size_t v_size_row;
  uint64_t v_size_row_ref;
  int32_t v_type_i;
  int32_t v_type_i_ref;
  uint32_t n_embd_v_gqa;
  uint32_t il_1;
  size_t k_size_row;
  uint64_t k_size_row_ref;
  int32_t k_type_i;
  int32_t k_type_i_ref;
  uint32_t n_embd_k_gqa;
  uint32_t il;
  uint32_t n_layer;
  uint32_t v_trans;
  uint32_t in_stack_ffffffffffffff2c;
  llama_hparams *in_stack_ffffffffffffff30;
  uint local_90;
  uint local_8c;
  ulong local_88;
  uint local_7c;
  ggml_type local_78;
  ggml_type local_74;
  uint local_70;
  uint local_6c;
  long local_68;
  long local_60;
  ggml_type local_58;
  ggml_type local_54;
  int local_50;
  uint local_4c;
  long local_48;
  long local_40;
  ggml_type local_34;
  ggml_type local_30;
  int local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  bool local_1;
  
  local_1c = in_EDX;
  (**(code **)(*in_RSI + 0x18))(in_RSI,&local_20,4);
  (**(code **)(*in_RSI + 0x18))(in_RSI,&local_24,4);
  if (local_24 == *(uint *)(*(long *)(in_RDI + 0x38) + 0x10)) {
    if (*(uint *)(in_RDI + 0x6c) < local_1c) {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,
                         "%s: not enough cells in kv cache to restore state (%u > %u)\n",
                         "state_read_data",(ulong)local_1c,(ulong)*(uint *)(in_RDI + 0x6c));
      local_1 = false;
    }
    else if (local_20 == (local_20 != 0)) {
      for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
        uVar2 = llama_hparams::n_embd_k_gqa(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
        uVar3 = llama_hparams::n_embd_k_s(*(llama_hparams **)(in_RDI + 0x38));
        local_2c = uVar2 + uVar3;
        (**(code **)(*in_RSI + 0x18))(in_RSI,&local_30,4);
        ppgVar4 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                            ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
                             (in_RDI + 0x90),(ulong)local_28);
        local_34 = (*ppgVar4)->type;
        if (local_34 != local_30) {
          llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: mismatched key type (%d != %d, layer %d)\n",
                             "state_read_data",(ulong)local_34,(ulong)local_30,(ulong)local_28);
          return false;
        }
        (**(code **)(*in_RSI + 0x18))(in_RSI,&local_40,8);
        ppgVar4 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                            ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
                             (in_RDI + 0x90),(ulong)local_28);
        local_48 = ggml_row_size((*ppgVar4)->type,local_2c);
        if (local_48 != local_40) {
          llama_log_internal(GGML_LOG_LEVEL_ERROR,
                             "%s: mismatched key row size (%zu != %zu, layer %d)\n",
                             "state_read_data",local_48,local_40,(ulong)local_28);
          return false;
        }
        if (local_1c != 0) {
          ppgVar4 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                              ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
                               (in_RDI + 0x90),(ulong)local_28);
          pgVar1 = *ppgVar4;
          uVar5 = (**(code **)(*in_RSI + 0x10))(in_RSI,(ulong)local_1c * local_48);
          ggml_backend_tensor_set
                    (pgVar1,uVar5,(ulong)*(uint *)(in_RDI + 0x68) * local_48,
                     (ulong)local_1c * local_48);
        }
      }
      if (local_20 == 0) {
        for (local_4c = 0; local_4c < local_24; local_4c = local_4c + 1) {
          uVar2 = llama_hparams::n_embd_v_gqa(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
          uVar3 = llama_hparams::n_embd_v_s(*(llama_hparams **)(in_RDI + 0x38));
          local_50 = uVar2 + uVar3;
          (**(code **)(*in_RSI + 0x18))(in_RSI,&local_54,4);
          ppgVar4 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                              ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
                               (in_RDI + 0xa8),(ulong)local_4c);
          local_58 = (*ppgVar4)->type;
          if (local_58 != local_54) {
            llama_log_internal(GGML_LOG_LEVEL_ERROR,
                               "%s: mismatched value type (%d != %d, layer %d)\n","state_read_data",
                               (ulong)local_58,(ulong)local_54,(ulong)local_4c);
            return false;
          }
          (**(code **)(*in_RSI + 0x18))(in_RSI,&local_60,8);
          ppgVar4 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                              ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
                               (in_RDI + 0xa8),(ulong)local_4c);
          local_68 = ggml_row_size((*ppgVar4)->type,local_50);
          if (local_68 != local_60) {
            llama_log_internal(GGML_LOG_LEVEL_ERROR,
                               "%s: mismatched value row size (%zu != %zu, layer %d)\n",
                               "state_read_data",local_68,local_60,(ulong)local_4c);
            return false;
          }
          if (local_1c != 0) {
            ppgVar4 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                                ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
                                 (in_RDI + 0xa8),(ulong)local_4c);
            pgVar1 = *ppgVar4;
            uVar5 = (**(code **)(*in_RSI + 0x10))(in_RSI,(ulong)local_1c * local_68);
            ggml_backend_tensor_set
                      (pgVar1,uVar5,(ulong)*(uint *)(in_RDI + 0x68) * local_68,
                       (ulong)local_1c * local_68);
          }
        }
      }
      else {
        for (local_6c = 0; local_6c < local_24; local_6c = local_6c + 1) {
          uVar2 = llama_hparams::n_embd_v_gqa(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
          uVar3 = llama_hparams::n_embd_v_s(*(llama_hparams **)(in_RDI + 0x38));
          local_70 = uVar2 + uVar3;
          (**(code **)(*in_RSI + 0x18))(in_RSI,&local_74,4);
          ppgVar4 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                              ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
                               (in_RDI + 0xa8),(ulong)local_6c);
          local_78 = (*ppgVar4)->type;
          if (local_78 != local_74) {
            llama_log_internal(GGML_LOG_LEVEL_ERROR,
                               "%s: mismatched value type (%d != %d, layer %d)\n","state_read_data",
                               (ulong)local_78,(ulong)local_74,(ulong)local_6c);
            return false;
          }
          (**(code **)(*in_RSI + 0x18))(in_RSI,&local_7c,4);
          ppgVar4 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                              ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
                               (in_RDI + 0xa8),(ulong)local_6c);
          local_88 = ggml_type_size((*ppgVar4)->type);
          if (local_88 != local_7c) {
            llama_log_internal(GGML_LOG_LEVEL_ERROR,
                               "%s: mismatched value element size (%zu != %zu, layer %d)\n",
                               "state_read_data",local_88,(ulong)local_7c,(ulong)local_6c);
            return false;
          }
          (**(code **)(*in_RSI + 0x18))(in_RSI,&local_8c,4);
          if (local_70 != local_8c) {
            llama_log_internal(GGML_LOG_LEVEL_ERROR,
                               "%s: mismatched GQA embedding size (%u != %u, layer %d)\n",
                               "state_read_data",(ulong)local_70,(ulong)local_8c,(ulong)local_6c);
            return false;
          }
          if (local_1c != 0) {
            for (local_90 = 0; local_90 < local_70; local_90 = local_90 + 1) {
              lVar6 = (*(int *)(in_RDI + 0x68) + local_90 * *(int *)(in_RDI + 0x6c)) * local_88;
              ppgVar4 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                                  ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
                                   (in_RDI + 0xa8),(ulong)local_6c);
              in_stack_ffffffffffffff30 = (llama_hparams *)*ppgVar4;
              uVar5 = (**(code **)(*in_RSI + 0x10))(in_RSI,local_1c * local_88);
              ggml_backend_tensor_set(in_stack_ffffffffffffff30,uVar5,lVar6,local_1c * local_88);
            }
          }
        }
      }
      local_1 = true;
    }
    else {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: incompatible V transposition\n","state_read_data"
                        );
      local_1 = false;
    }
  }
  else {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: mismatched layer count (%u instead of %u)\n",
                       "state_read_data",(ulong)local_24,
                       (ulong)*(uint *)(*(long *)(in_RDI + 0x38) + 0x10));
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool llama_kv_cache_unified::state_read_data(llama_io_read_i & io, uint32_t cell_count) {
    uint32_t v_trans;
    uint32_t n_layer;
    io.read_to(&v_trans, sizeof(v_trans));
    io.read_to(&n_layer, sizeof(n_layer));

    if (n_layer != hparams.n_layer) {
        LLAMA_LOG_ERROR("%s: mismatched layer count (%u instead of %u)\n", __func__, n_layer, hparams.n_layer);
        return false;
    }
    if (cell_count > size) {
        LLAMA_LOG_ERROR("%s: not enough cells in kv cache to restore state (%u > %u)\n", __func__, cell_count, size);
        return false;
    }
    if (v_trans != (bool) v_trans) {
        LLAMA_LOG_ERROR("%s: incompatible V transposition\n", __func__);
        return false;
    }

    // For each layer, read the keys for each cell, one row is one cell, read as one contiguous block
    for (uint32_t il = 0; il < n_layer; ++il) {
        const uint32_t n_embd_k_gqa = hparams.n_embd_k_gqa(il) + hparams.n_embd_k_s();

        // Read type of key
        int32_t k_type_i_ref;
        io.read_to(&k_type_i_ref, sizeof(k_type_i_ref));
        const int32_t k_type_i = (int32_t) k_l[il]->type;
        if (k_type_i != k_type_i_ref) {
            LLAMA_LOG_ERROR("%s: mismatched key type (%d != %d, layer %d)\n", __func__, k_type_i, k_type_i_ref, il);
            return false;
        }

        // Read row size of key
        uint64_t k_size_row_ref;
        io.read_to(&k_size_row_ref, sizeof(k_size_row_ref));
        const size_t k_size_row = ggml_row_size(k_l[il]->type, n_embd_k_gqa);
        if (k_size_row != k_size_row_ref) {
            LLAMA_LOG_ERROR("%s: mismatched key row size (%zu != %zu, layer %d)\n", __func__, k_size_row, (size_t) k_size_row_ref, il);
            return false;
        }

        if (cell_count) {
            // Read and set the keys for the whole cell range
            ggml_backend_tensor_set(k_l[il], io.read(cell_count * k_size_row), head * k_size_row, cell_count * k_size_row);
        }
    }

    if (!v_trans) {
        for (uint32_t il = 0; il < n_layer; ++il) {
            const uint32_t n_embd_v_gqa = hparams.n_embd_v_gqa(il) + hparams.n_embd_v_s();

            // Read type of value
            int32_t v_type_i_ref;
            io.read_to(&v_type_i_ref, sizeof(v_type_i_ref));
            const int32_t v_type_i = (int32_t)v_l[il]->type;
            if (v_type_i != v_type_i_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value type (%d != %d, layer %d)\n", __func__, v_type_i, v_type_i_ref, il);
                return false;
            }

            // Read row size of value
            uint64_t v_size_row_ref;
            io.read_to(&v_size_row_ref, sizeof(v_size_row_ref));
            const size_t v_size_row = ggml_row_size(v_l[il]->type, n_embd_v_gqa);
            if (v_size_row != v_size_row_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value row size (%zu != %zu, layer %d)\n", __func__, v_size_row, (size_t) v_size_row_ref, il);
                return false;
            }

            if (cell_count) {
                // Read and set the values for the whole cell range
                ggml_backend_tensor_set(v_l[il], io.read(cell_count * v_size_row), head * v_size_row, cell_count * v_size_row);
            }
        }
    } else {
        // For each layer, read the values for each cell (transposed)
        for (uint32_t il = 0; il < n_layer; ++il) {
            const uint32_t n_embd_v_gqa = hparams.n_embd_v_gqa(il) + hparams.n_embd_v_s();

            // Read type of value
            int32_t v_type_i_ref;
            io.read_to(&v_type_i_ref, sizeof(v_type_i_ref));
            const int32_t v_type_i = (int32_t)v_l[il]->type;
            if (v_type_i != v_type_i_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value type (%d != %d, layer %d)\n", __func__, v_type_i, v_type_i_ref, il);
                return false;
            }

            // Read element size of value
            uint32_t v_size_el_ref;
            io.read_to(&v_size_el_ref, sizeof(v_size_el_ref));
            const size_t v_size_el = ggml_type_size(v_l[il]->type);
            if (v_size_el != v_size_el_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value element size (%zu != %zu, layer %d)\n", __func__, v_size_el, (size_t) v_size_el_ref, il);
                return false;
            }

            // Read GQA embedding size
            uint32_t n_embd_v_gqa_ref;
            io.read_to(&n_embd_v_gqa_ref, sizeof(n_embd_v_gqa_ref));
            if (n_embd_v_gqa != n_embd_v_gqa_ref) {
                LLAMA_LOG_ERROR("%s: mismatched GQA embedding size (%u != %u, layer %d)\n", __func__, n_embd_v_gqa, n_embd_v_gqa_ref, il);
                return false;
            }

            if (cell_count) {
                // For each row in the transposed matrix, read the values for the whole cell range
                for (uint32_t j = 0; j < n_embd_v_gqa; ++j) {
                    const size_t dst_offset = (head + j * size) * v_size_el;
                    ggml_backend_tensor_set(v_l[il], io.read(cell_count * v_size_el), dst_offset, cell_count * v_size_el);
                }
            }
        }
    }

    return true;
}